

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mel_generalized_cepstral_analysis.h
# Opt level: O3

void __thiscall sptk::MelGeneralizedCepstralAnalysis::Buffer::Buffer(Buffer *this)

{
  this->_vptr_Buffer = (_func_int **)&PTR__Buffer_0011f258;
  memset(&this->b_,0,0x1b0);
  (this->buffer_for_fourier_transform_)._vptr_Buffer = (_func_int **)&PTR__Buffer_0011f228;
  (this->buffer_for_fourier_transform_).real_part_input_.
  super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x0;
  (this->buffer_for_fourier_transform_).real_part_input_.
  super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data._M_finish =
       (pointer)0x0;
  (this->buffer_for_fourier_transform_).real_part_input_.
  super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  (this->buffer_for_fourier_transform_).imag_part_input_.
  super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x0;
  (this->buffer_for_fourier_transform_).imag_part_input_.
  super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data._M_finish =
       (pointer)0x0;
  (this->buffer_for_fourier_transform_).imag_part_input_.
  super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  (this->buffer_for_inverse_fourier_transform_)._vptr_Buffer = (_func_int **)&PTR__Buffer_0011f288;
  (this->buffer_for_inverse_fourier_transform_).fast_fourier_transform_buffer_._vptr_Buffer =
       (_func_int **)&PTR__Buffer_0011f228;
  (this->buffer_for_inverse_fourier_transform_).fast_fourier_transform_buffer_.real_part_input_.
  super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x0;
  (this->buffer_for_inverse_fourier_transform_).fast_fourier_transform_buffer_.real_part_input_.
  super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data._M_finish =
       (pointer)0x0;
  (this->buffer_for_inverse_fourier_transform_).fast_fourier_transform_buffer_.real_part_input_.
  super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  (this->buffer_for_inverse_fourier_transform_).fast_fourier_transform_buffer_.imag_part_input_.
  super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x0;
  (this->buffer_for_inverse_fourier_transform_).fast_fourier_transform_buffer_.imag_part_input_.
  super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data._M_finish =
       (pointer)0x0;
  (this->buffer_for_inverse_fourier_transform_).fast_fourier_transform_buffer_.imag_part_input_.
  super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  ToeplitzPlusHankelSystemSolver::Buffer::Buffer(&this->buffer_for_system_solver_);
  (this->buffer_for_mel_generalized_cepstrum_transform_)._vptr_Buffer =
       (_func_int **)&PTR__Buffer_0011f2e8;
  (this->buffer_for_mel_generalized_cepstrum_transform_).frequency_transform_buffer_._vptr_Buffer =
       (_func_int **)&PTR__Buffer_0011f318;
  (this->buffer_for_mel_generalized_cepstrum_transform_).frequency_transform_buffer_.d_.
  super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x0;
  (this->buffer_for_mel_generalized_cepstrum_transform_).frequency_transform_buffer_.d_.
  super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data._M_finish =
       (pointer)0x0;
  (this->buffer_for_mel_generalized_cepstrum_transform_).frequency_transform_buffer_.d_.
  super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  (this->buffer_for_mel_generalized_cepstrum_transform_).temporary_mel_generalized_cepstrum_.
  super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x0;
  (this->buffer_for_mel_generalized_cepstrum_transform_).temporary_mel_generalized_cepstrum_.
  super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data._M_finish =
       (pointer)0x0;
  (this->buffer_for_mel_generalized_cepstrum_transform_).temporary_mel_generalized_cepstrum_.
  super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  MelCepstralAnalysis::Buffer::Buffer(&this->buffer_for_mel_cepstral_analysis_);
  return;
}

Assistant:

virtual ~Buffer() {
    }